

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O1

void __thiscall
duckdb::WindowSegmentTreeState::Evaluate
          (WindowSegmentTreeState *this,WindowSegmentTreeGlobalState *gtstate,DataChunk *bounds,
          Vector *result,idx_t count,idx_t row_idx)

{
  unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
  *this_00;
  char cVar1;
  _Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false> this_01;
  undefined1 auVar2 [8];
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> tree;
  const_reference pvVar3;
  _Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false> _Var4;
  pointer pWVar5;
  type other;
  ValidityArray *this_02;
  _Hash_node_base *ends;
  idx_t *begins;
  __buckets_ptr count_00;
  idx_t *ends_00;
  pointer row_idx_00;
  idx_t *piVar6;
  undefined1 local_80 [8];
  undefined1 local_78 [48];
  idx_t *local_48;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> local_40;
  Vector *local_38;
  
  local_78._32_8_ = row_idx;
  pvVar3 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
  local_78._40_8_ = pvVar3->data;
  pvVar3 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
  local_78._24_8_ = pvVar3->data;
  pvVar3 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
  local_48 = (idx_t *)pvVar3->data;
  pvVar3 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
  begins = (idx_t *)pvVar3->data;
  local_78._16_8_ = &this->part;
  local_40._M_head_impl = (WindowCursor *)gtstate;
  if ((this->part).
      super_unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      .super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>._M_head_impl ==
      (WindowSegmentTreePart *)0x0) {
    unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator->
              (&(this->super_WindowAggregatorLocalState).cursor);
    WindowCursor::Copy((WindowCursor *)local_78);
    _Var4._M_head_impl = (WindowSegmentTreePart *)operator_new(0x1f8);
    local_80 = (undefined1  [8])local_78._0_8_;
    local_78._0_8_ = (WindowSegmentTreePart *)0x0;
    local_78._8_8_ = this;
    WindowSegmentTreePart::WindowSegmentTreePart
              (_Var4._M_head_impl,
               &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator,
               &(gtstate->super_WindowAggregatorGlobalState).aggr,
               (unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
               local_80,&(gtstate->super_WindowAggregatorGlobalState).filter_mask);
    if (local_80 != (undefined1  [8])0x0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)local_80,(WindowCursor *)local_80);
    }
    this_01._M_head_impl =
         (((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
            *)local_78._16_8_)->_M_t).
         super___uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
         .super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>._M_head_impl;
    (((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
       *)local_78._16_8_)->_M_t).
    super___uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
    .super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>._M_head_impl = _Var4._M_head_impl
    ;
    if (this_01._M_head_impl != (WindowSegmentTreePart *)0x0) {
      WindowSegmentTreePart::~WindowSegmentTreePart(this_01._M_head_impl);
      operator_delete(this_01._M_head_impl);
    }
    this = (WindowSegmentTreeState *)local_78._8_8_;
    if ((WindowSegmentTreePart *)local_78._0_8_ != (WindowSegmentTreePart *)0x0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)local_78,(WindowCursor *)local_78._0_8_);
      this = (WindowSegmentTreeState *)local_78._8_8_;
    }
  }
  tree._M_head_impl = local_40._M_head_impl;
  piVar6 = local_48;
  this_02 = (ValidityArray *)local_78._16_8_;
  cVar1 = *(char *)(((local_40._M_head_impl)->state).current_row_index + 0x1a8);
  local_78._8_8_ = count;
  local_38 = result;
  if (cVar1 == '\0') {
    pWVar5 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                           *)local_78._16_8_);
    count_00 = (__buckets_ptr)local_78._8_8_;
    WindowSegmentTreePart::Evaluate
              (pWVar5,(WindowSegmentTreeGlobalState *)tree._M_head_impl,(idx_t *)local_78._40_8_,
               (idx_t *)local_78._24_8_,(idx_t *)0x0,(Vector *)row_idx,local_78._8_8_,
               local_78._32_8_,FULL);
  }
  else {
    ends_00 = local_48;
    if (cVar1 == '\x01') {
      ends_00 = begins;
    }
    pWVar5 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                           *)local_78._16_8_);
    row_idx_00 = (pointer)local_78._32_8_;
    ends = (_Hash_node_base *)local_78._24_8_;
    count_00 = (__buckets_ptr)local_78._8_8_;
    WindowSegmentTreePart::Evaluate
              (pWVar5,(WindowSegmentTreeGlobalState *)tree._M_head_impl,(idx_t *)local_78._40_8_,
               ends_00,(idx_t *)local_78._24_8_,(Vector *)row_idx,local_78._8_8_,local_78._32_8_,
               LEFT);
    this_00 = &this->right_part;
    if ((this->right_part).
        super_unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
        .super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>._M_head_impl ==
        (WindowSegmentTreePart *)0x0) {
      unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
      ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                    *)local_78._16_8_);
      WindowSegmentTreePart::Copy((WindowSegmentTreePart *)local_80);
      auVar2 = local_80;
      local_80 = (undefined1  [8])0x0;
      _Var4._M_head_impl =
           (this_00->
           super_unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
           .super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>._M_head_impl;
      (this_00->
      super_unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      .super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>._M_head_impl =
           (WindowSegmentTreePart *)auVar2;
      if (_Var4._M_head_impl != (WindowSegmentTreePart *)0x0) {
        WindowSegmentTreePart::~WindowSegmentTreePart(_Var4._M_head_impl);
        operator_delete(_Var4._M_head_impl);
      }
      auVar2 = local_80;
      ends = (_Hash_node_base *)local_78._24_8_;
      count_00 = (__buckets_ptr)local_78._8_8_;
      row_idx_00 = (pointer)local_78._32_8_;
      piVar6 = local_48;
      if ((_Head_base<0UL,_duckdb::WindowCursor_*,_false>)local_80 !=
          (_Head_base<0UL,_duckdb::WindowCursor_*,_false>)0x0) {
        WindowSegmentTreePart::~WindowSegmentTreePart((WindowSegmentTreePart *)local_80);
        operator_delete((void *)auVar2);
        ends = (_Hash_node_base *)local_78._24_8_;
        count_00 = (__buckets_ptr)local_78._8_8_;
        row_idx_00 = (pointer)local_78._32_8_;
        piVar6 = local_48;
      }
    }
    if (cVar1 == '\x01') {
      begins = piVar6;
    }
    pWVar5 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->(this_00);
    WindowSegmentTreePart::Evaluate
              (pWVar5,(WindowSegmentTreeGlobalState *)local_40._M_head_impl,begins,(idx_t *)ends,
               (idx_t *)local_78._40_8_,(Vector *)row_idx,(idx_t)count_00,(idx_t)row_idx_00,RIGHT);
    this_02 = (ValidityArray *)local_78._16_8_;
    pWVar5 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                           *)local_78._16_8_);
    other = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
            ::operator*(this_00);
    WindowSegmentTreePart::Combine(pWVar5,other,(idx_t)count_00);
  }
  pWVar5 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
           ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                         *)this_02);
  WindowSegmentTreePart::Finalize(pWVar5,local_38,(idx_t)count_00);
  return;
}

Assistant:

void WindowSegmentTreeState::Evaluate(const WindowSegmentTreeGlobalState &gtstate, const DataChunk &bounds,
                                      Vector &result, idx_t count, idx_t row_idx) {
	auto window_begin = FlatVector::GetData<const idx_t>(bounds.data[FRAME_BEGIN]);
	auto window_end = FlatVector::GetData<const idx_t>(bounds.data[FRAME_END]);
	auto peer_begin = FlatVector::GetData<const idx_t>(bounds.data[PEER_BEGIN]);
	auto peer_end = FlatVector::GetData<const idx_t>(bounds.data[PEER_END]);

	if (!part) {
		part = make_uniq<WindowSegmentTreePart>(allocator, gtstate.aggr, cursor->Copy(), gtstate.filter_mask);
	}

	if (gtstate.aggregator.exclude_mode != WindowExcludeMode::NO_OTHER) {
		// If we exclude the current row, then both left and right need to contain it.
		const bool exclude_current = gtstate.aggregator.exclude_mode == WindowExcludeMode::CURRENT_ROW;

		// 1. evaluate the tree left of the excluded part
		auto middle = exclude_current ? peer_end : peer_begin;
		part->Evaluate(gtstate, window_begin, middle, window_end, result, count, row_idx, WindowSegmentTreePart::LEFT);

		// 2. set up a second state for the right of the excluded part
		if (!right_part) {
			right_part = part->Copy();
		}

		// 3. evaluate the tree right of the excluded part
		middle = exclude_current ? peer_begin : peer_end;
		right_part->Evaluate(gtstate, middle, window_end, window_begin, result, count, row_idx,
		                     WindowSegmentTreePart::RIGHT);

		// 4. combine the buffer state into the Segment Tree State
		part->Combine(*right_part, count);
	} else {
		part->Evaluate(gtstate, window_begin, window_end, nullptr, result, count, row_idx, WindowSegmentTreePart::FULL);
	}

	part->Finalize(result, count);
}